

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerup::DoEffect(APowerup *this)

{
  TObjPtr<AActor> *obj;
  uint uVar1;
  uint uVar2;
  AActor *pAVar3;
  uint uVar4;
  
  obj = &(this->super_AInventory).Owner;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((((pAVar3 != (AActor *)0x0) &&
       (pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar3->player != (player_t *)0x0)) &&
      (uVar1 = *(uint *)&(this->super_AInventory).field_0x4dc, 0 < (int)uVar1)) &&
     (uVar2 = (this->BlendColor).field_0.d, (uVar2 & 0xffff0000) == 0xb60000)) {
    uVar4 = uVar2;
    if (uVar1 < 0x81 && (uVar1 & 8) == 0) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      uVar4 = 0xffff;
      if ((uVar2 & 0xffff) != (int)pAVar3->player->fixedcolormap) {
        return;
      }
    }
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar3->player->fixedcolormap = (short)uVar4;
  }
  return;
}

Assistant:

void APowerup::DoEffect ()
{
	if (Owner == NULL || Owner->player == NULL)
	{
		return;
	}

	if (EffectTics > 0)
	{
		int Colormap = GetSpecialColormap(BlendColor);

		if (Colormap != NOFIXEDCOLORMAP)
		{
			if (EffectTics > BLINKTHRESHOLD || (EffectTics & 8))
			{
				Owner->player->fixedcolormap = Colormap;
			}
			else if (Owner->player->fixedcolormap == Colormap)	
			{
				// only unset if the fixed colormap comes from this item
				Owner->player->fixedcolormap = NOFIXEDCOLORMAP;
			}
		}
	}
}